

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

int __thiscall Bracket::copy(Bracket *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  list<Atom_*,_std::allocator<Atom_*>_> *this_00;
  undefined8 *puVar1;
  _List_node_base *p_Var2;
  value_type local_30;
  
  puVar1 = (undefined8 *)operator_new(0x40);
  *puVar1 = &PTR__Bracket_00108c40;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  this_00 = (list<Atom_*,_std::allocator<Atom_*>_> *)(puVar1 + 5);
  puVar1[6] = this_00;
  puVar1[5] = this_00;
  puVar1[7] = 0;
  std::__cxx11::string::_M_assign((string *)(puVar1 + 1));
  p_Var2 = (_List_node_base *)&this->para;
  while (p_Var2 = (((_List_base<Atom_*,_std::allocator<Atom_*>_> *)&p_Var2->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var2 != (_List_node_base *)&this->para) {
    local_30 = (value_type)(**(code **)(*(long *)p_Var2[1]._M_next + 0x20))();
    std::__cxx11::list<Atom_*,_std::allocator<Atom_*>_>::push_back(this_00,&local_30);
  }
  return (int)puVar1;
}

Assistant:

Atom *Bracket::copy() {
    auto result = new Bracket();
    result->func = func;
    for (auto &i: para) {
        result->para.push_back(i->copy());
    }
    return result;
}